

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O0

int codebook_decode_deinterleave_repeat
              (vorb *f,Codebook *c,float **outputs,int ch,int *c_inter_p,int *p_inter_p,int len,
              int total_decode)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int in_ECX;
  long in_RDX;
  int *in_RSI;
  vorb *in_RDI;
  int *in_R8;
  int *in_R9;
  int in_stack_00000008;
  float val_1;
  float val;
  int n;
  float last;
  int effective;
  int z;
  int i;
  int p_inter;
  int c_inter;
  undefined4 in_stack_ffffffffffffffa0;
  float in_stack_ffffffffffffffa4;
  float fVar6;
  int in_stack_ffffffffffffffbc;
  int local_40;
  int local_3c;
  int local_4;
  
  local_3c = *in_R8;
  local_40 = *in_R9;
  iVar5 = *in_RSI;
  if (*(char *)((long)in_RSI + 0x19) == '\0') {
    local_4 = error(in_RDI,VORBIS_invalid_stream);
  }
  else {
    for (; 0 < (int)val; val = (float)((int)val - iVar5)) {
      fVar6 = 0.0;
      if (in_RDI->valid_bits < 10) {
        prep_huffman((vorb *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      }
      iVar4 = (int)*(short *)((long)in_RSI + (long)(int)(in_RDI->acc & 0x3ff) * 2 + 0x30);
      if (iVar4 < 0) {
        iVar4 = codebook_decode_scalar_raw
                          ((vorb *)CONCAT44(in_stack_ffffffffffffffbc,iVar4),
                           (Codebook *)CONCAT44(iVar5,fVar6));
      }
      else {
        bVar1 = *(byte *)(*(long *)(in_RSI + 2) + (long)iVar4);
        in_RDI->acc = in_RDI->acc >> (bVar1 & 0x1f);
        in_RDI->valid_bits = in_RDI->valid_bits - (uint)bVar1;
        if (in_RDI->valid_bits < 0) {
          in_RDI->valid_bits = 0;
          iVar4 = -1;
        }
      }
      if (iVar4 < 0) {
        if ((in_RDI->bytes_in_seg == '\0') && (in_RDI->last_seg != 0)) {
          return 0;
        }
        iVar5 = error(in_RDI,VORBIS_invalid_stream);
        return iVar5;
      }
      if (in_stack_00000008 * in_ECX < local_3c + local_40 * in_ECX + iVar5) {
        iVar5 = in_stack_00000008 * in_ECX - (local_40 * in_ECX - local_3c);
      }
      iVar2 = *in_RSI;
      if (*(char *)((long)in_RSI + 0x1a) == '\0') {
        for (in_stack_ffffffffffffffbc = 0; in_stack_ffffffffffffffbc < iVar5;
            in_stack_ffffffffffffffbc = in_stack_ffffffffffffffbc + 1) {
          in_stack_ffffffffffffffa4 =
               *(float *)(*(long *)(in_RSI + 8) +
                         (long)(iVar2 * iVar4 + in_stack_ffffffffffffffbc) * 4) + fVar6;
          if (*(long *)(in_RDX + (long)local_3c * 8) != 0) {
            lVar3 = *(long *)(in_RDX + (long)local_3c * 8);
            *(float *)(lVar3 + (long)local_40 * 4) =
                 in_stack_ffffffffffffffa4 + *(float *)(lVar3 + (long)local_40 * 4);
          }
          local_3c = local_3c + 1;
          if (local_3c == in_ECX) {
            local_3c = 0;
            local_40 = local_40 + 1;
          }
        }
      }
      else {
        for (in_stack_ffffffffffffffbc = 0; in_stack_ffffffffffffffbc < iVar5;
            in_stack_ffffffffffffffbc = in_stack_ffffffffffffffbc + 1) {
          fVar6 = *(float *)(*(long *)(in_RSI + 8) +
                            (long)(iVar2 * iVar4 + in_stack_ffffffffffffffbc) * 4) + fVar6;
          if (*(long *)(in_RDX + (long)local_3c * 8) != 0) {
            lVar3 = *(long *)(in_RDX + (long)local_3c * 8);
            *(float *)(lVar3 + (long)local_40 * 4) = fVar6 + *(float *)(lVar3 + (long)local_40 * 4);
          }
          local_3c = local_3c + 1;
          if (local_3c == in_ECX) {
            local_3c = 0;
            local_40 = local_40 + 1;
          }
        }
      }
    }
    *in_R8 = local_3c;
    *in_R9 = local_40;
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int codebook_decode_deinterleave_repeat(vorb *f, Codebook *c, float **outputs, int ch, int *c_inter_p, int *p_inter_p, int len, int total_decode)
{
   int c_inter = *c_inter_p;
   int p_inter = *p_inter_p;
   int i,z, effective = c->dimensions;

   // type 0 is only legal in a scalar context
   if (c->lookup_type == 0)   return error(f, VORBIS_invalid_stream);

   while (total_decode > 0) {
      float last = CODEBOOK_ELEMENT_BASE(c);
      DECODE_VQ(z,f,c);
      #ifndef STB_VORBIS_DIVIDES_IN_CODEBOOK
      assert(!c->sparse || z < c->sorted_entries);
      #endif
      if (z < 0) {
         if (!f->bytes_in_seg)
            if (f->last_seg) return FALSE;
         return error(f, VORBIS_invalid_stream);
      }

      // if this will take us off the end of the buffers, stop short!
      // we check by computing the length of the virtual interleaved
      // buffer (len*ch), our current offset within it (p_inter*ch)+(c_inter),
      // and the length we'll be using (effective)
      if (c_inter + p_inter*ch + effective > len * ch) {
         effective = len*ch - (p_inter*ch - c_inter);
      }

   #ifdef STB_VORBIS_DIVIDES_IN_CODEBOOK
      if (c->lookup_type == 1) {
         int div = 1;
         for (i=0; i < effective; ++i) {
            int off = (z / div) % c->lookup_values;
            float val = CODEBOOK_ELEMENT_FAST(c,off) + last;
            if (outputs[c_inter])
               outputs[c_inter][p_inter] += val;
            if (++c_inter == ch) { c_inter = 0; ++p_inter; }
            if (c->sequence_p) last = val;
            div *= c->lookup_values;
         }
      } else
   #endif
      {
         z *= c->dimensions;
         if (c->sequence_p) {
            for (i=0; i < effective; ++i) {
               float val = CODEBOOK_ELEMENT_FAST(c,z+i) + last;
               if (outputs[c_inter])
                  outputs[c_inter][p_inter] += val;
               if (++c_inter == ch) { c_inter = 0; ++p_inter; }
               last = val;
            }
         } else {
            for (i=0; i < effective; ++i) {
               float val = CODEBOOK_ELEMENT_FAST(c,z+i) + last;
               if (outputs[c_inter])
                  outputs[c_inter][p_inter] += val;
               if (++c_inter == ch) { c_inter = 0; ++p_inter; }
            }
         }
      }

      total_decode -= effective;
   }
   *c_inter_p = c_inter;
   *p_inter_p = p_inter;
   return TRUE;
}